

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * printStmt(void)

{
  treeNode *this;
  treeNode *extraout_RAX;
  double __x;
  allocator local_51;
  string local_50;
  string local_30;
  
  this = (treeNode *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_30,"",&local_51);
  treeNode::treeNode(this,printStmt,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_50,"print",&local_51);
  match(&local_50,Empty);
  __x = (double)std::__cxx11::string::~string((string *)&local_50);
  exp(__x);
  this->child[0] = extraout_RAX;
  return this;
}

Assistant:

treeNode* printStmt()
{
    auto ret = new treeNode(StmtKind::printStmt,"");
    match("print");
    ret->child[0]=exp();
    return ret;
}